

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meiju_1.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  undefined8 in_RAX;
  istream *this;
  long *plVar2;
  int iVar3;
  bool bVar4;
  int m;
  int n;
  undefined8 local_18;
  
  local_18 = in_RAX;
  this = (istream *)std::istream::operator>>((istream *)&std::cin,(int *)((long)&local_18 + 4));
  std::istream::operator>>(this,(int *)&local_18);
  iVar3 = 0;
  if (local_18._4_4_ <= (int)local_18) {
    iVar3 = 0;
    do {
      bVar4 = local_18._4_4_ != 0;
      iVar1 = local_18._4_4_;
      if (bVar4) {
        for (; (iVar1 % 10 != 4 && (bVar4 = iVar1 - 10U < 0xffffffed, bVar4)); iVar1 = iVar1 / 10) {
        }
      }
      iVar3 = iVar3 + (uint)(bVar4 ^ 1);
      bVar4 = local_18._4_4_ != (int)local_18;
      local_18._4_4_ = local_18._4_4_ + 1;
    } while (bVar4);
  }
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return 0;
}

Assistant:

int main()
{
    int n,m,cnt = 0;
    cin >> n >> m;
    for (int i = n; i <= m; ++i) {
        if(!judge(i))
        {
            cnt++;
        }
    }
    cout << cnt << endl;
    return 0;
}